

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

void get_subformats_context
               (FMFormat_conflict fmformat,FMFormat_conflict **format_list_p,int *format_count_p,
               FMFormat_conflict **stack_p)

{
  FMFormat_conflict p_Var1;
  ulong uVar2;
  FMFormat_conflict *pp_Var3;
  FMFormat_conflict *pp_Var4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  FMFormat_conflict fmformat_00;
  
  uVar2 = 8;
  do {
    uVar7 = uVar2;
    uVar2 = uVar7 + 8;
  } while (*(long *)((long)*stack_p + (uVar7 - 8)) != 0);
  pp_Var3 = (FMFormat_conflict *)ffs_realloc(*stack_p,uVar7 + 8 & 0x7fffffff8);
  *stack_p = pp_Var3;
  *(FMFormat_conflict *)((long)pp_Var3 + (uVar7 - 8)) = fmformat;
  *(undefined8 *)((long)pp_Var3 + uVar7) = 0;
  if (0 < fmformat->field_count) {
    lVar8 = 0;
    do {
      fmformat_00 = fmformat->field_subformats[lVar8];
      pp_Var4 = pp_Var3;
      if (fmformat_00 != (FMFormat_conflict)0x0) {
        do {
          p_Var1 = *pp_Var4;
          if (p_Var1 == fmformat_00) break;
          pp_Var4 = pp_Var4 + 1;
        } while (p_Var1 != (FMFormat_conflict)0x0);
        if (p_Var1 != fmformat_00) {
          get_subformats_context(fmformat_00,format_list_p,format_count_p,stack_p);
          pp_Var3 = *stack_p;
        }
        pp_Var4 = (FMFormat_conflict *)ffs_realloc(*format_list_p,(long)*format_count_p * 8 + 0x10);
        *format_list_p = pp_Var4;
        lVar5 = (long)*format_count_p;
        if (0 < lVar5) {
          lVar6 = 0;
          do {
            if (pp_Var4[lVar6] == fmformat_00) {
              fmformat_00 = (FMFormat_conflict)0x0;
            }
            lVar6 = lVar6 + 1;
          } while (lVar5 != lVar6);
        }
        if (fmformat_00 != (FMFormat_conflict)0x0) {
          *format_count_p = *format_count_p + 1;
          pp_Var4[lVar5] = fmformat_00;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < fmformat->field_count);
  }
  return;
}

Assistant:

static
void
get_subformats_context(FMFormat fmformat, FMFormat **format_list_p, int *format_count_p,
		       FMFormat **stack_p)
{
    int field;
    int stack_depth = 0;
    FMFormat *stack = *stack_p;
    while(stack[stack_depth] != NULL) stack_depth++;
    *stack_p = stack = realloc(stack, sizeof(stack[0]) * (stack_depth + 2));
    stack[stack_depth] = fmformat;
    stack[stack_depth+1] = NULL;
    for (field = 0; field < fmformat->field_count; field++) {
	FMFormat subformat = fmformat->field_subformats[field];
	if (subformat != NULL) {
	    int i;
	    int j = 0;
	    while((stack[j] != subformat) && (stack[j] != NULL)) j++;
	    if (stack[j] != subformat) {
		/* if we're not already getting this subformat, recurse */
		get_subformats_context(subformat, format_list_p, format_count_p, stack_p);
		/* stack might have been realloc'd */
		stack = *stack_p;
	    }
	    *format_list_p = realloc(*format_list_p,
			       sizeof(FMFormat) * (*format_count_p + 2));
	    for (i=0; i< *format_count_p; i++) {
		if ((*format_list_p)[i] == subformat) {
		    /* don't add it if it's already there */
		    subformat = NULL;
		}
	    }
	    if (subformat != NULL) {
		(*format_list_p)[(*format_count_p)++] = subformat;
	    }
	}
    }
}